

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeMapConstructor
               (DynamicObject *mapConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  Var value;
  DynamicObject **ppDVar1;
  PropertyString *value_00;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *mapConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,mapConstructor,mode,3,0);
  this = RecyclableObject::GetLibrary(&mapConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&mapConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(0);
  AddMember(this,mapConstructor,0xd1,value,'\x02');
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).mapPrototype);
  AddMember(this,mapConstructor,0x124,*ppDVar1,'\0');
  AddSpeciesAccessorsToLibraryObject
            (this,mapConstructor,(FunctionInfo *)JavascriptMap::EntryInfo::GetterSymbolSpecies);
  value_00 = ScriptContext::GetPropertyString(this_00,0xd6);
  AddMember(this,mapConstructor,0x106,value_00,'\x02');
  DynamicObject::SetHasNoEnumerableProperties(mapConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeMapConstructor(DynamicObject* mapConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(mapConstructor, mode, 3);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterMap
        // so that the update is in sync with profiler
        JavascriptLibrary* library = mapConstructor->GetLibrary();
        ScriptContext* scriptContext = mapConstructor->GetScriptContext();
        library->AddMember(mapConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable);
        library->AddMember(mapConstructor, PropertyIds::prototype, library->mapPrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(mapConstructor, &JavascriptMap::EntryInfo::GetterSymbolSpecies);
        library->AddMember(mapConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Map), PropertyConfigurable);

        mapConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }